

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O3

void __thiscall
bloaty::RangeMapTest::AssertRollupEquals
          (RangeMapTest *this,
          vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *maps,
          vector<bloaty::RangeMapTest::Row,_std::allocator<bloaty::RangeMapTest::Row>_> *rows)

{
  vector<bloaty::RangeMapTest::Row,_std::allocator<bloaty::RangeMapTest::Row>_> *in_RCX;
  pointer *__ptr;
  char *message;
  anon_class_16_2_d7075cc7 func;
  int i;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined4 local_14;
  
  local_14 = 0;
  func.rows = in_RCX;
  func.i = (int *)rows;
  RangeMap::
  ComputeRollup<bloaty::RangeMapTest::AssertRollupEquals(std::vector<bloaty::RangeMap_const*,std::allocator<bloaty::RangeMap_const*>>,std::vector<bloaty::RangeMapTest::Row,std::allocator<bloaty::RangeMapTest::Row>>const&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long,unsigned_long)_1_>
            ((RangeMap *)maps,
             (vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *)
             &stack0xffffffffffffffec,func);
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)(rows->
               super__Vector_base<bloaty::RangeMapTest::Row,_std::allocator<bloaty::RangeMapTest::Row>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(rows->
               super__Vector_base<bloaty::RangeMapTest::Row,_std::allocator<bloaty::RangeMapTest::Row>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_28,"rows.size()","i",(unsigned_long *)&local_38,(int *)&stack0xffffffffffffffec);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_3e5733 + 0x11;
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
               ,0x3b,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

void AssertRollupEquals(const std::vector<const RangeMap*> maps,
                          const std::vector<Row>& rows) {
    int i = 0;
    RangeMap::ComputeRollup(
        maps, [&i, &rows](const std::vector<std::string>& keys, uint64_t start,
                          uint64_t end) {
          ASSERT_LT(i, rows.size());
          const auto& row = rows[i];
          ASSERT_EQ(row.keys, keys);
          ASSERT_EQ(row.start, start);
          ASSERT_EQ(row.end, end);
          i++;
        });
    ASSERT_EQ(rows.size(), i);
  }